

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O0

matches * atomimm_a(iasctx *ctx,void *v,int spos)

{
  easm_expr *peVar1;
  int iVar2;
  easm_expr *expr;
  matches *res;
  bitfield *bf;
  int spos_local;
  void *v_local;
  iasctx *ctx_local;
  
  if ((spos == ctx->atomsnum) || (ctx->atoms[spos]->type != LITEM_EXPR)) {
    ctx_local = (iasctx *)0x0;
  }
  else {
    ctx_local = (iasctx *)alwaysmatches(spos + 1);
    peVar1 = ctx->atoms[spos]->expr;
    if ((peVar1->type != EASM_EXPR_NUM) ||
       (iVar2 = setbf((match *)ctx_local->isa,(bitfield *)v,peVar1->num), iVar2 == 0)) {
      free((match *)ctx_local->isa);
      free(ctx_local);
      ctx_local = (iasctx *)0x0;
    }
  }
  return (matches *)ctx_local;
}

Assistant:

struct matches *atomimm_a APROTO {
	const struct bitfield *bf = v;
	if (spos == ctx->atomsnum || ctx->atoms[spos]->type != LITEM_EXPR)
		return 0;
	struct matches *res = alwaysmatches(spos+1);
	struct easm_expr *expr = ctx->atoms[spos]->expr;
	if (expr->type == EASM_EXPR_NUM && setbf(res->m, bf, expr->num))
		return res;
	else {
		free(res->m);
		free(res);
		return 0;
	}
}